

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::DumpImplicitArgIns(FunctionBody *dumpFunction)

{
  bool bVar1;
  ArgSlot AVar2;
  RegSlot RVar3;
  char16 *pcVar4;
  uint local_14;
  RegSlot reg;
  FunctionBody *dumpFunction_local;
  
  AVar2 = ParseableFunctionInfo::GetInParamsCount(&dumpFunction->super_ParseableFunctionInfo);
  if ((1 < AVar2) &&
     (bVar1 = ParseableFunctionInfo::GetHasImplicitArgIns
                        (&dumpFunction->super_ParseableFunctionInfo), bVar1)) {
    Output::Print(L"    Implicit Arg Ins:\n    ======== === ===\n    ");
    for (local_14 = 1;
        AVar2 = ParseableFunctionInfo::GetInParamsCount(&dumpFunction->super_ParseableFunctionInfo),
        local_14 < AVar2; local_14 = local_14 + 1) {
      RVar3 = FunctionBody::GetConstantCount(dumpFunction);
      DumpReg((local_14 + RVar3) - 1);
      pcVar4 = OpCodeUtil::GetOpCodeName(ArgIn_A);
      Output::Print(L"%-11s",pcVar4);
      Output::Print(L"In%d\n    ",(ulong)local_14);
    }
    bVar1 = ParseableFunctionInfo::GetHasRestParameter(&dumpFunction->super_ParseableFunctionInfo);
    if (bVar1) {
      RVar3 = FunctionBody::GetRestParamRegSlot(dumpFunction);
      DumpReg(RVar3);
      pcVar4 = OpCodeUtil::GetOpCodeName(ArgIn_Rest);
      Output::Print(L"%-11s",pcVar4);
      AVar2 = ParseableFunctionInfo::GetInParamsCount(&dumpFunction->super_ParseableFunctionInfo);
      Output::Print(L"In%d\n    ",(ulong)AVar2);
    }
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpImplicitArgIns(FunctionBody * dumpFunction)
    {
        if (dumpFunction->GetInParamsCount() <= 1 || !dumpFunction->GetHasImplicitArgIns())
        {
            return;
        }
        Output::Print(_u("    Implicit Arg Ins:\n    ======== === ===\n    "));
        for (RegSlot reg = 1;
            reg < dumpFunction->GetInParamsCount(); reg++)
        {
            DumpReg((RegSlot)(reg + dumpFunction->GetConstantCount() - 1));
            // DisableJIT-TODO: Should this entire function be ifdefed?
#if ENABLE_NATIVE_CODEGEN
            Output::Print(_u("%-11s"), OpCodeUtil::GetOpCodeName(Js::OpCode::ArgIn_A));
#endif
            Output::Print(_u("In%d\n    "), reg);
        }
        if (dumpFunction->GetHasRestParameter())
        {
            DumpReg(dumpFunction->GetRestParamRegSlot());
#if ENABLE_NATIVE_CODEGEN
            Output::Print(_u("%-11s"), OpCodeUtil::GetOpCodeName(Js::OpCode::ArgIn_Rest));
#endif
            Output::Print(_u("In%d\n    "), dumpFunction->GetInParamsCount());
        }
        Output::Print(_u("\n"));
    }